

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

bool __thiscall ValueType::HasBeenPrimitive(ValueType *this)

{
  bool bVar1;
  Bits BVar2;
  undefined1 local_19;
  ValueType *this_local;
  
  bVar1 = OneOn(this,Object);
  if (bVar1) {
    BVar2 = operator|(Undefined,Null);
    local_19 = AnyOn(this,BVar2);
  }
  else {
    BVar2 = operator|(Undefined,Null);
    BVar2 = operator|(BVar2,Int);
    BVar2 = operator|(BVar2,Float);
    BVar2 = operator|(BVar2,Number);
    BVar2 = operator|(BVar2,Boolean);
    BVar2 = operator|(BVar2,String);
    BVar2 = operator|(BVar2,Symbol);
    BVar2 = operator|(BVar2,PrimitiveOrObject);
    BVar2 = operator|(BVar2,Simd);
    local_19 = AnyOn(this,BVar2);
  }
  return local_19;
}

Assistant:

bool ValueType::HasBeenPrimitive() const
{
    return
        OneOn(Bits::Object)
            ?
                AnyOn(Bits::Undefined | Bits::Null)
            :
                AnyOn(
                    Bits::Undefined |
                    Bits::Null |
                    Bits::Int |
                    Bits::Float |
                    Bits::Number |
                    Bits::Boolean |
                    Bits::String |
                    Bits::Symbol |
                    Bits::PrimitiveOrObject |
                    Bits::Simd);
}